

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O2

int __thiscall Sphere::init(Sphere *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double local_a8;
  Vector3 local_68;
  Vector3 local_48;
  
  local_a8 = -1.0;
  for (iVar1 = -1; iVar1 < 2; iVar1 = iVar1 + 2) {
    dVar3 = -1.0;
    for (in_EAX = -1; in_EAX < 2; in_EAX = in_EAX + 2) {
      dVar4 = -1.0;
      for (iVar2 = -1; iVar2 < 2; iVar2 = iVar2 + 2) {
        local_68.y = this->r;
        local_68.z = local_68.y * dVar4;
        local_68.x = local_68.y * local_a8;
        local_68.y = local_68.y * dVar3;
        operator+(&this->center,&local_68);
        BoundingBox::include(&this->bbox,&local_48);
        dVar4 = dVar4 + 2.0;
      }
      dVar3 = dVar3 + 2.0;
    }
    local_a8 = local_a8 + 2.0;
  }
  return in_EAX;
}

Assistant:

void Sphere::init()
{
    for (int i = -1; i < 2; i += 2)
        for (int j = -1; j < 2; j += 2)
            for (int k = -1; k < 2; k += 2)
                bbox.include(center + Vector3(i * r, j * r, k * r));
    Primitive::init();
}